

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O3

int __thiscall GPIOClass::export_gpio(GPIOClass *this)

{
  ostream *poVar1;
  int iVar2;
  string export_str;
  ofstream exportgpio;
  long *local_238 [2];
  long local_228 [2];
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/sys/class/gpio/export","");
  std::ofstream::ofstream(&local_218,(char *)local_238[0],_S_out);
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_218,(this->gpionum)._M_dataplus._M_p,
               (this->gpionum)._M_string_length);
    iVar2 = 0;
    std::ofstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," OPERATION FAILED: Unable to export GPIO",0x28);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->gpionum)._M_dataplus._M_p,
                        (this->gpionum)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," .",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    iVar2 = -1;
    std::ostream::flush();
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _connect;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  return iVar2;
}

Assistant:

int GPIOClass::export_gpio()
{
    string export_str = "/sys/class/gpio/export";
    ofstream exportgpio(export_str.c_str()); // Open "export" file. Convert C++ string to C string. Required for all Linux pathnames
    if (!exportgpio){
        cout << " OPERATION FAILED: Unable to export GPIO"<< this->gpionum <<" ."<< endl;
        return -1;
    }

    exportgpio << this->gpionum ; //write GPIO number to export
    exportgpio.close(); //close export file
    return 0;
}